

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ReadObject(JSContext *ctx,uint8_t *buf,size_t buf_len,int flags)

{
  JSContext *ctx_00;
  uint32_t uVar1;
  JSAtom *pJVar2;
  byte bVar3;
  int iVar4;
  JSAtom JVar5;
  JSString *p;
  ulong uVar6;
  BCReaderState *s;
  ulong uVar7;
  int64_t iVar8;
  ulong uVar9;
  JSValue JVar10;
  BCReaderState ss;
  BCReaderState local_88;
  ulong local_38;
  
  ctx->binary_object_count = ctx->binary_object_count + 1;
  ctx->binary_object_size = ctx->binary_object_size + (int)buf_len;
  local_88.objects = (JSObject **)0x0;
  local_88.idx_to_atom = (JSAtom *)0x0;
  local_88.objects_count = 0;
  local_88.objects_size = 0;
  local_88.buf_end = buf + buf_len;
  local_88._48_8_ =
       (ulong)((flags & 8U) << 0x15 | (uint)flags >> 2 & 1 | (flags & 2U) << 0xf | (flags & 1U) << 8
              ) << 0x20;
  local_88.first_atom = 0xd2;
  if ((flags & 1U) == 0) {
    local_88.first_atom = 1;
  }
  local_88.idx_to_atom_count = 0;
  uVar1 = local_88.idx_to_atom_count;
  local_88.idx_to_atom_count = 0;
  local_88.ctx = ctx;
  local_88.buf_start = buf;
  if ((long)buf_len < 1) {
    local_88.ptr = buf;
    local_88.idx_to_atom_count = uVar1;
    JS_ThrowSyntaxError(ctx,"read after the end of the buffer");
    local_88.error_state = 0xffffffff;
    bVar3 = 0;
  }
  else {
    local_88.ptr = buf + 1;
    bVar3 = *buf;
  }
  iVar8 = 6;
  if (0 < (long)buf_len) {
    if (bVar3 == 1) {
      iVar4 = bc_get_leb128(&local_88,&local_88.idx_to_atom_count);
      if (iVar4 == 0) {
        uVar6 = (ulong)local_88.idx_to_atom_count;
        if (uVar6 != 0) {
          local_88.idx_to_atom = (JSAtom *)js_mallocz(local_88.ctx,uVar6 * 4);
          if (local_88.idx_to_atom == (JSAtom *)0x0) {
LAB_0012db43:
            local_88.error_state = 0xffffffff;
            goto LAB_0012da19;
          }
          if (uVar6 != 0) {
            uVar6 = 0;
            do {
              p = JS_ReadString(&local_88);
              if (p == (JSString *)0x0) goto LAB_0012da19;
              JVar5 = JS_NewAtomStr(local_88.ctx,p);
              if (JVar5 == 0) goto LAB_0012db43;
              local_88.idx_to_atom[uVar6] = JVar5;
              if (((local_88._48_8_ & 0xff000000000000) != 0) &&
                 (local_88.first_atom + (int)uVar6 != JVar5)) {
                local_88._48_8_ = local_88._48_8_ & 0xff00ffffffffffff;
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < local_88.idx_to_atom_count);
          }
        }
        JVar10 = JS_ReadObjectRec(&local_88);
        iVar8 = JVar10.tag;
        uVar9 = (ulong)JVar10.u.ptr & 0xffffffff00000000;
        uVar6 = (ulong)JVar10.u._0_4_;
        goto LAB_0012da1c;
      }
    }
    else {
      JS_ThrowSyntaxError(ctx,"invalid version (%d expected=%d)",(ulong)bVar3,1);
    }
  }
LAB_0012da19:
  uVar6 = 0;
  uVar9 = 0;
LAB_0012da1c:
  pJVar2 = local_88.idx_to_atom;
  ctx_00 = local_88.ctx;
  if (local_88.idx_to_atom != (JSAtom *)0x0) {
    uVar7 = (ulong)local_88.idx_to_atom_count;
    local_38 = uVar6;
    if (uVar7 != 0) {
      uVar6 = 0;
      do {
        JS_FreeAtom(ctx_00,pJVar2[uVar6]);
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    (*((local_88.ctx)->rt->mf).js_free)(&(local_88.ctx)->rt->malloc_state,pJVar2);
    uVar6 = local_38;
  }
  (*((local_88.ctx)->rt->mf).js_free)(&(local_88.ctx)->rt->malloc_state,local_88.objects);
  JVar10.tag = iVar8;
  JVar10.u.ptr = (void *)(uVar9 | uVar6);
  return JVar10;
}

Assistant:

JSValue JS_ReadObject(JSContext *ctx, const uint8_t *buf, size_t buf_len,
                       int flags)
{
    BCReaderState ss, *s = &ss;
    JSValue obj;

    ctx->binary_object_count += 1;
    ctx->binary_object_size += buf_len;

    memset(s, 0, sizeof(*s));
    s->ctx = ctx;
    s->buf_start = buf;
    s->buf_end = buf + buf_len;
    s->ptr = buf;
    s->allow_bytecode = ((flags & JS_READ_OBJ_BYTECODE) != 0);
    s->is_rom_data = ((flags & JS_READ_OBJ_ROM_DATA) != 0);
    s->allow_sab = ((flags & JS_READ_OBJ_SAB) != 0);
    s->allow_reference = ((flags & JS_READ_OBJ_REFERENCE) != 0);
    if (s->allow_bytecode)
        s->first_atom = JS_ATOM_END;
    else
        s->first_atom = 1;
    if (JS_ReadObjectAtoms(s)) {
        obj = JS_EXCEPTION;
    } else {
        obj = JS_ReadObjectRec(s);
    }
    bc_reader_free(s);
    return obj;
}